

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback_ret.cpp
# Opt level: O3

long data_cb_ret_nframes(cubeb_stream *stream,void *user,void *inputbuffer,void *outputbuffer,
                        long nframes)

{
  bool bVar1;
  stringstream *this;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult local_40;
  char *local_30 [2];
  
  LOCK();
  *(int *)user = *user + 1;
  UNLOCK();
  LOCK();
  *(int *)((long)user + 4) = *(int *)((long)user + 4) + 1;
  UNLOCK();
  if (nframes < 1) {
    local_40.success_ = false;
    local_40.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    this = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this);
    *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
    local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(this + 0x10),"nframes should not be 0 in data callback!",0x29);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_30,&local_40,"false","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_callback_ret.cpp"
               ,0x59,local_30[0]);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_30[0] != (char *)0x0) {
      operator_delete__(local_30[0]);
    }
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else if (outputbuffer != (void *)0x0) {
    memset(outputbuffer,0,nframes * 2);
  }
  return nframes;
}

Assistant:

long data_cb_ret_nframes(cubeb_stream * stream, void * user, const void * inputbuffer, void * outputbuffer, long nframes)
{
  user_state_callback_ret * u = (user_state_callback_ret *)user;
  u->cb_count++;
  // Every callback returns nframes, so every callback is expected
  u->expected_cb_count++;
  if (nframes < 1) {
    // This shouldn't happen
    EXPECT_TRUE(false) << "nframes should not be 0 in data callback!";
  }
  if (outputbuffer != NULL) {
    // If we have an output buffer insert silence
    short * ob = (short *) outputbuffer;
    for (long i = 0; i < nframes; i++) {
      ob[i] = 0;
    }
  }
  return nframes;
}